

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

void CheckFunction(LlvmCompilationContext *ctx,LLVMValueRef function,InplaceStr name)

{
  int iVar1;
  uint uVar2;
  char *local_30;
  char *error;
  LLVMValueRef function_local;
  LlvmCompilationContext *ctx_local;
  InplaceStr name_local;
  
  name_local.begin = name.end;
  ctx_local = (LlvmCompilationContext *)name.begin;
  error = (char *)function;
  function_local = (LLVMValueRef)ctx;
  iVar1 = LLVMVerifyFunction(function,LLVMReturnStatusAction);
  if (iVar1 != 0) {
    LLVMDumpValue((LLVMValueRef)error);
    uVar2 = InplaceStr::length((InplaceStr *)&ctx_local);
    printf("LLVM function \'%.*s\' verification failed\n",(ulong)uVar2,ctx_local);
    local_30 = (char *)0x0;
    iVar1 = LLVMVerifyModule(*(LLVMModuleRef *)(function_local + 0x18),LLVMReturnStatusAction,
                             &local_30);
    if (iVar1 != 0) {
      printf("%s\n",local_30);
    }
    LLVMDisposeMessage(local_30);
  }
  return;
}

Assistant:

void CheckFunction(LlvmCompilationContext &ctx, LLVMValueRef function, InplaceStr name)
{
	(void)ctx;
	(void)function;
	(void)name;

#if !defined(NDEBUG)
	// Check result
	if(LLVMVerifyFunction(function, LLVMReturnStatusAction))
	{
		LLVMDumpValue(function);

		printf("LLVM function '%.*s' verification failed\n", name.length(), name.begin);

		char *error = NULL;

		if(LLVMVerifyModule(ctx.module, LLVMReturnStatusAction, &error))
			printf("%s\n", error);

		LLVMDisposeMessage(error);
	}
#endif
}